

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

int lj_record_mm_lookup(jit_State *J,RecordIndex *ix,MMS mm)

{
  byte bVar1;
  uint32_t uVar2;
  IRRef1 IVar3;
  uint uVar4;
  TRef TVar5;
  TRef TVar6;
  uint uVar7;
  anon_struct_8_2_fd66bcdd_for_TValue_2 *paVar8;
  anon_struct_8_2_f9ee98fb_for_u32 *paVar9;
  void *ptr;
  ulong uVar10;
  GCobj *o;
  TValue local_78;
  uint local_70;
  undefined4 local_6c;
  TRef local_48;
  TRef local_44;
  undefined4 local_40;
  undefined4 local_34;
  
  uVar7 = ix->tab;
  uVar4 = uVar7 & 0x1f000000;
  if (uVar4 == 0xc000000) {
    ptr = (void *)(ulong)(ix->tabv).u32.lo;
    bVar1 = *(byte *)((long)ptr + 6);
    o = (GCobj *)(ulong)*(uint *)((long)ptr + 0x10);
    if (bVar1 != 0) {
      if (bVar1 == 2) {
        TVar6 = lj_ir_kptr_(J,IR_KPTR,ptr);
        IVar3 = (IRRef1)TVar6;
        (J->fold).ins.field_0.ot = 0x885;
      }
      else {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4310000a;
        uVar7 = lj_opt_fold(J);
        TVar6 = lj_ir_kint(J,(uint)bVar1);
        IVar3 = (IRRef1)TVar6;
        (J->fold).ins.field_0.ot = 0x893;
      }
      (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
      (J->fold).ins.field_0.op2 = IVar3;
      lj_opt_fold(J);
LAB_0013258a:
      uVar7 = *(uint *)((long)J + (ulong)mm * 4 + -0x98);
      paVar9 = (anon_struct_8_2_f9ee98fb_for_u32 *)
               ((ulong)((MRef *)&(o->uv).dhash)->ptr32 +
               (ulong)((o->pt).sizekn & *(uint *)((ulong)uVar7 + 8)) * 0x18);
      do {
        if ((paVar9[1].hi == 0xfffffffb) && (paVar9[1].lo == uVar7)) goto LAB_001325bc;
        paVar9 = (anon_struct_8_2_f9ee98fb_for_u32 *)(ulong)paVar9[2].lo;
      } while (paVar9 != (anon_struct_8_2_f9ee98fb_for_u32 *)0x0);
      paVar9 = (anon_struct_8_2_f9ee98fb_for_u32 *)0x0;
LAB_001325bc:
      if (paVar9 == (anon_struct_8_2_f9ee98fb_for_u32 *)0x0) {
        return 0;
      }
      uVar2 = paVar9->hi;
      if ((uVar2 != 0xfffffff4) && (uVar2 != 0xfffffff7)) {
        if (uVar2 != 0xffffffff) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        return 0;
      }
      (ix->mobjv).u32 = *paVar9;
      TVar6 = lj_ir_kgc(J,(GCobj *)(ulong)paVar9->lo,(uint)(paVar9->hi != 0xfffffff7) * 3 + IRT_FUNC
                       );
      ix->mobj = TVar6;
      ix->mtv = (GCtab *)o;
      ix->mt = 0x7fff;
      return 1;
    }
    IVar3 = 9;
  }
  else {
    if (uVar4 != 0xb000000) {
      uVar7 = (ix->tabv).field_2.it;
      uVar10 = 0x23;
      if ((0xfffeffff < uVar7) && (uVar10 = 0x19, (uVar7 & 0xffff8000) != 0xffff0000)) {
        uVar10 = (ulong)(0x15 - uVar7);
      }
      o = (GCobj *)(ulong)*(uint *)((long)J + uVar10 * 4 + -0x98);
      if (o == (GCobj *)0x0) {
        ix->mt = 0x7fff;
        return 0;
      }
      if (uVar4 == 0xa000000) goto LAB_0013258a;
      local_48 = lj_ir_kgc(J,o,IRT_TAB);
      ix->mt = local_48;
      goto LAB_0013248b;
    }
    o = (GCobj *)(ulong)*(uint *)((ulong)(ix->tabv).u32.lo + 0x10);
    IVar3 = 3;
  }
  (J->fold).ins.field_0.ot = 0x430b;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
  (J->fold).ins.field_0.op2 = IVar3;
  TVar5 = lj_opt_fold(J);
  TVar6 = 0x7fff;
  if (o != (GCobj *)0x0) {
    TVar6 = TVar5;
  }
  ix->mt = TVar6;
  local_48 = TVar5;
  TVar6 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = (ushort)(o != (GCobj *)0x0) << 8 | 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
  lj_opt_fold(J);
LAB_0013248b:
  if (o == (GCobj *)0x0) {
    return 0;
  }
  local_70 = *(uint *)((long)J + (ulong)mm * 4 + -0x98);
  paVar8 = (anon_struct_8_2_fd66bcdd_for_TValue_2 *)
           ((ulong)((MRef *)&(o->uv).dhash)->ptr32 +
           (ulong)((o->pt).sizekn & (((GCobj *)(ulong)local_70)->str).hash) * 0x18);
  do {
    if ((paVar8[1].it == 0xfffffffb) && (paVar8[1].field_0.i == local_70)) goto LAB_001324c6;
    paVar8 = (anon_struct_8_2_fd66bcdd_for_TValue_2 *)(ulong)(uint)paVar8[2].field_0.i;
  } while (paVar8 != (anon_struct_8_2_fd66bcdd_for_TValue_2 *)0x0);
  paVar8 = (anon_struct_8_2_fd66bcdd_for_TValue_2 *)0x0;
LAB_001324c6:
  if ((paVar8 != (anon_struct_8_2_fd66bcdd_for_TValue_2 *)0x0) && (paVar8->it != 0xffffffff)) {
    (ix->mobjv).field_2 = *paVar8;
  }
  ix->mtv = (GCtab *)o;
  local_78.u32.lo = (uint32_t)o;
  local_78.field_2.it = 0xfffffff4;
  local_6c = 0xfffffffb;
  local_44 = lj_ir_kgc(J,(GCobj *)(ulong)local_70,IRT_STR);
  local_40 = 0;
  local_34 = 0;
  TVar6 = lj_record_idx(J,(RecordIndex *)&local_78.field_2);
  ix->mobj = TVar6;
  return (uint)((TVar6 & 0x1f000000) != 0);
}

Assistant:

int lj_record_mm_lookup(jit_State *J, RecordIndex *ix, MMS mm)
{
  RecordIndex mix;
  GCtab *mt;
  if (tref_istab(ix->tab)) {
    mt = tabref(tabV(&ix->tabv)->metatable);
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
  } else if (tref_isudata(ix->tab)) {
    int udtype = udataV(&ix->tabv)->udtype;
    mt = tabref(udataV(&ix->tabv)->metatable);
    /* The metatables of special userdata objects are treated as immutable. */
    if (udtype != UDTYPE_USERDATA) {
      cTValue *mo;
      if (LJ_HASFFI && udtype == UDTYPE_FFI_CLIB) {
	/* Specialize to the C library namespace object. */
	emitir(IRTG(IR_EQ, IRT_P32), ix->tab, lj_ir_kptr(J, udataV(&ix->tabv)));
      } else {
	/* Specialize to the type of userdata. */
	TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), ix->tab, IRFL_UDATA_UDTYPE);
	emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, udtype));
      }
  immutable_mt:
      mo = lj_tab_getstr(mt, mmname_str(J2G(J), mm));
      if (!mo || tvisnil(mo))
	return 0;  /* No metamethod. */
      /* Treat metamethod or index table as immutable, too. */
      if (!(tvisfunc(mo) || tvistab(mo)))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      copyTV(J->L, &ix->mobjv, mo);
      ix->mobj = lj_ir_kgc(J, gcV(mo), tvisfunc(mo) ? IRT_FUNC : IRT_TAB);
      ix->mtv = mt;
      ix->mt = TREF_NIL;  /* Dummy value for comparison semantics. */
      return 1;  /* Got metamethod or index table. */
    }
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_UDATA_META);
  } else {
    /* Specialize to base metatable. Must flush mcode in lua_setmetatable(). */
    mt = tabref(basemt_obj(J2G(J), &ix->tabv));
    if (mt == NULL) {
      ix->mt = TREF_NIL;
      return 0;  /* No metamethod. */
    }
    /* The cdata metatable is treated as immutable. */
    if (LJ_HASFFI && tref_iscdata(ix->tab)) goto immutable_mt;
    ix->mt = mix.tab = lj_ir_ktab(J, mt);
    goto nocheck;
  }
  ix->mt = mt ? mix.tab : TREF_NIL;
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mix.tab, lj_ir_knull(J, IRT_TAB));
nocheck:
  if (mt) {
    GCstr *mmstr = mmname_str(J2G(J), mm);
    cTValue *mo = lj_tab_getstr(mt, mmstr);
    if (mo && !tvisnil(mo))
      copyTV(J->L, &ix->mobjv, mo);
    ix->mtv = mt;
    settabV(J->L, &mix.tabv, mt);
    setstrV(J->L, &mix.keyv, mmstr);
    mix.key = lj_ir_kstr(J, mmstr);
    mix.val = 0;
    mix.idxchain = 0;
    ix->mobj = lj_record_idx(J, &mix);
    return !tref_isnil(ix->mobj);  /* 1 if metamethod found, 0 if not. */
  }
  return 0;  /* No metamethod. */
}